

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

void __thiscall absl::base_internal::anon_unknown_0::ArenaLock::Leave(ArenaLock *this)

{
  Arena *this_00;
  uint uVar1;
  
  this_00 = this->arena_;
  LOCK();
  uVar1 = (this_00->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
  (this_00->mu).lockword_.super___atomic_base<unsigned_int>._M_i =
       (this_00->mu).lockword_.super___atomic_base<unsigned_int>._M_i & 2;
  UNLOCK();
  if (7 < uVar1) {
    SpinLock::SlowUnlock(&this_00->mu,uVar1);
  }
  if (this->mask_valid_ == true) {
    uVar1 = pthread_sigmask(2,(__sigset_t *)&this->mask_,(__sigset_t *)0x0);
    if (uVar1 != 0) {
      raw_logging_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x12d,"pthread_sigmask failed: %d",(ulong)uVar1);
    }
  }
  this->left_ = true;
  return;
}

Assistant:

void Leave() ABSL_UNLOCK_FUNCTION() {
    arena_->mu.Unlock();
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
    if (mask_valid_) {
      const int err = pthread_sigmask(SIG_SETMASK, &mask_, nullptr);
      if (err != 0) {
        ABSL_RAW_LOG(FATAL, "pthread_sigmask failed: %d", err);
      }
    }
#endif
    left_ = true;
  }